

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoding_backend_init_memory__stbvorbis
                    (void *pUserData,void *pData,size_t dataSize,ma_decoding_backend_config *pConfig
                    ,ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  ma_stbvorbis *pVorbis;
  ma_decoding_backend_config *extraout_RDX;
  ma_decoding_backend_config *pConfig_00;
  undefined1 auVar2 [16];
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pVorbis = (ma_stbvorbis *)malloc(0xe0);
    pConfig_00 = extraout_RDX;
  }
  else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    pVorbis = (ma_stbvorbis *)0x0;
    pConfig_00 = (ma_decoding_backend_config *)dataSize;
  }
  else {
    auVar2 = (undefined1  [16])
             (*pAllocationCallbacks->onMalloc)(0xe0,pAllocationCallbacks->pUserData);
    pConfig_00 = auVar2._8_8_;
    pVorbis = auVar2._0_8_;
  }
  if (pVorbis == (ma_stbvorbis *)0x0) {
    mVar1 = MA_OUT_OF_MEMORY;
  }
  else {
    mVar1 = ma_stbvorbis_init_memory
                      (pData,dataSize,pConfig_00,(ma_allocation_callbacks *)pConfig,pVorbis);
    if (mVar1 == MA_SUCCESS) {
      *ppBackend = pVorbis;
      mVar1 = MA_SUCCESS;
    }
    else if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      free(pVorbis);
    }
    else if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
      (*pAllocationCallbacks->onFree)(pVorbis,pAllocationCallbacks->pUserData);
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init_memory__stbvorbis(void* pUserData, const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_stbvorbis* pVorbis;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pVorbis = (ma_stbvorbis*)ma_malloc(sizeof(*pVorbis), pAllocationCallbacks);
    if (pVorbis == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_stbvorbis_init_memory(pData, dataSize, pConfig, pAllocationCallbacks, pVorbis);
    if (result != MA_SUCCESS) {
        ma_free(pVorbis, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pVorbis;

    return MA_SUCCESS;
}